

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolverAPGD.cpp
# Opt level: O2

void __thiscall
chrono::ChSolverAPGD::ShurBvectorCompute(ChSolverAPGD *this,ChSystemDescriptor *sysd)

{
  ChVectorDynamic<> *this_00;
  pointer ppCVar1;
  ChVariables *this_01;
  pointer ppCVar2;
  ChConstraint *pCVar3;
  Scalar *pSVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  Scalar in_XMM0_Qa;
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> local_88 [24];
  void *local_70;
  ChVectorRef local_60;
  ChVectorRef local_48;
  
  uVar5 = 0;
  while( true ) {
    ppCVar1 = (sysd->vvariables).
              super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar6 = (ulong)uVar5;
    if ((ulong)((long)(sysd->vvariables).
                      super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar1 >> 3) <= uVar6)
    break;
    this_01 = ppCVar1[uVar6];
    if (this_01->disabled == false) {
      ChVariables::Get_qb(&local_48,this_01);
      ChVariables::Get_fb(&local_60,
                          (sysd->vvariables).
                          super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar6]);
      Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
      Ref<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
                (local_88,&local_60.
                           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                );
      (*this_01->_vptr_ChVariables[4])(this_01,&local_48,local_88);
      Eigen::internal::handmade_aligned_free(local_70);
    }
    uVar5 = uVar5 + 1;
  }
  this_00 = &this->r;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this_00);
  iVar7 = 0;
  uVar5 = 0;
  while( true ) {
    ppCVar2 = (sysd->vconstraints).
              super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(sysd->vconstraints).
                      super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar2 >> 3) <=
        (ulong)uVar5) break;
    pCVar3 = ppCVar2[uVar5];
    if (pCVar3->active == true) {
      (*pCVar3->_vptr_ChConstraint[7])();
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                          (long)iVar7,0);
      iVar7 = iVar7 + 1;
      *pSVar4 = in_XMM0_Qa;
    }
    uVar5 = uVar5 + 1;
  }
  (*sysd->_vptr_ChSystemDescriptor[0xd])(sysd,&this->tmp);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)this_00,
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->tmp);
  return;
}

Assistant:

void ChSolverAPGD::ShurBvectorCompute(ChSystemDescriptor& sysd) {
    // ***TO DO*** move the following thirty lines in a short function ChSystemDescriptor::ShurBvectorCompute() ?

    // Compute the b_shur vector in the Shur complement equation N*l = b_shur
    // with
    //   N_shur  = D'* (M^-1) * D
    //   b_shur  = - c + D'*(M^-1)*k = b_i + D'*(M^-1)*k
    // but flipping the sign of lambdas,  b_shur = - b_i - D'*(M^-1)*k
    // Do this in three steps:

    // Put (M^-1)*k    in  q  sparse vector of each variable..
    for (unsigned int iv = 0; iv < sysd.GetVariablesList().size(); iv++)
        if (sysd.GetVariablesList()[iv]->IsActive())
            sysd.GetVariablesList()[iv]->Compute_invMb_v(sysd.GetVariablesList()[iv]->Get_qb(),
                                                         sysd.GetVariablesList()[iv]->Get_fb());  // q = [M]'*fb

    // ...and now do  b_shur = - D'*q = - D'*(M^-1)*k ..
    r.setZero();
    int s_i = 0;
    for (unsigned int ic = 0; ic < sysd.GetConstraintsList().size(); ic++)
        if (sysd.GetConstraintsList()[ic]->IsActive()) {
            r(s_i, 0) = sysd.GetConstraintsList()[ic]->Compute_Cq_q();
            ++s_i;
        }

    // ..and finally do   b_shur = b_shur - c
    sysd.BuildBiVector(tmp);  // b_i   =   -c   = phi/h
    r += tmp;
}